

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::EmitLoadInstance
          (ByteCodeGenerator *this,Symbol *sym,IdentPtr pid,RegSlot *pThisLocation,
          RegSlot *pInstLocation,FuncInfo *funcInfo)

{
  RegSlot *pRVar1;
  Scope *symScope;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  PropertyId PVar5;
  uint uVar6;
  ByteCodeLabel labelID;
  RegSlot RVar7;
  Scope **ppSVar8;
  undefined4 *puVar9;
  Scope *scope;
  Type *pTVar10;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 *paVar11;
  OpCode OVar12;
  DynamicLoadKind DVar13;
  ByteCodeWriter *this_00;
  int i;
  int index;
  undefined1 local_b8 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  undefined1 local_58 [8];
  DynamicLoadRecord rec;
  RegSlot local_44;
  PropertyId envIndex;
  RegSlot local_34;
  
  local_44 = *pThisLocation;
  local_34 = *pInstLocation;
  rec.field_2.index = 0xffffffff;
  ppSVar8 = &sym->scope;
  if (sym == (Symbol *)0x0) {
    ppSVar8 = &this->globalScope;
  }
  symScope = *ppSVar8;
  recList._40_8_ = pid;
  if (symScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1073,"(symScope)","symScope");
    if (!bVar3) goto LAB_0080a405;
    *puVar9 = 0;
  }
  if ((sym != (Symbol *)0x0) && ((sym->field_0x43 & 0x40) != 0)) {
    *pInstLocation = 0xffffffff;
    return;
  }
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       this->alloc;
  local_b8 = (undefined1  [8])&PTR_IsReadOnly_014dd580;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  this_00 = &this->m_writer;
  rec.label = -1;
  scope = (Scope *)0x0;
  while (scope = FindScopeForSym(this,symScope,scope,(PropertyId *)&rec.field_2.index,funcInfo),
        scope != this->globalScope) {
    if (local_34 == 0xffffffff && scope != symScope) {
      local_34 = FuncInfo::AcquireTmpRegister(funcInfo);
    }
    if (rec.field_2.index == 0xffffffff) {
      if (scope->func != funcInfo) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1094,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()");
        if (!bVar3) goto LAB_0080a405;
        *puVar9 = 0;
      }
      rec.label = scope->location;
    }
    if (scope == symScope) break;
    if ((scope == (Scope *)0x0) || (uVar4 = *(ushort *)&scope->field_0x44, (uVar4 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x109e,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar3) goto LAB_0080a405;
      *puVar9 = 0;
      uVar4 = *(ushort *)&scope->field_0x44;
    }
    if ((uVar4 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x109f,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar3) goto LAB_0080a405;
      *puVar9 = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)local_58);
    local_58._4_4_ = Js::ByteCodeWriter::DefineLabel(this_00);
    if (sym == (Symbol *)0x0) {
      PVar5 = *(PropertyId *)(recList._40_8_ + 0x1c);
    }
    else {
      PVar5 = Symbol::EnsurePosition(sym,this);
    }
    uVar6 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar5);
    if (scope->scopeType == ScopeType_With) {
      if (local_44 == 0xffffffff) {
        local_44 = FuncInfo::AcquireTmpRegister(funcInfo);
      }
      if (rec.field_2.index == 0xffffffff) {
        Js::ByteCodeWriter::BrProperty(this_00,BrOnHasProperty,local_58._4_4_,rec.label,uVar6);
        local_58._0_4_ = LocalWith;
        rec.kind = rec.label;
      }
      else {
        DVar13 = rec.field_2.index + Local;
        Js::ByteCodeWriter::BrEnvProperty(this_00,BrOnHasEnvProperty,local_58._4_4_,uVar6,DVar13);
        local_58._0_4_ = EnvWith;
        rec.kind = DVar13;
      }
    }
    else if (rec.field_2.index == 0xffffffff) {
      Js::ByteCodeWriter::BrLocalProperty(this_00,BrOnHasLocalProperty,local_58._4_4_,uVar6);
      local_58._0_4_ = Local;
    }
    else {
      DVar13 = rec.field_2.index + Local;
      Js::ByteCodeWriter::BrEnvProperty(this_00,BrOnHasLocalEnvProperty,local_58._4_4_,uVar6,DVar13)
      ;
      local_58._0_4_ = Env;
      rec.kind = DVar13;
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)local_b8,0);
    *(DynamicLoadKind *)
     ((long)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
            _vptr_ReadOnlyList +
     (long)(int)recList.
                super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                buffer * 0xc + 8) = rec.kind;
    *(ulong *)((long)recList.
                     super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                     _vptr_ReadOnlyList +
              (long)(int)recList.
                         super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                         .buffer * 0xc) = CONCAT44(local_58._4_4_,local_58._0_4_);
    recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
    _0_4_ = (int)recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 buffer + 1;
  }
  if ((sym == (Symbol *)0x0) || ((sym->field_0x42 & 8) != 0)) {
    if ((this->flags & 0x404) == 0) {
      if (local_34 == 0xffffffff) {
        local_34 = 0xfffffffd;
      }
      else {
        Js::ByteCodeWriter::Reg2(this_00,Ld_A,local_34,0xfffffffd);
      }
      RVar7 = funcInfo->undefinedConstantRegister;
      if (local_44 != 0xffffffff) {
        Js::ByteCodeWriter::Reg2(this_00,Ld_A,local_44,RVar7);
        RVar7 = local_44;
      }
    }
    else {
      if (local_34 == 0xffffffff) {
        local_34 = FuncInfo::AcquireTmpRegister(funcInfo);
      }
      if (sym == (Symbol *)0x0) {
        PVar5 = *(PropertyId *)(recList._40_8_ + 0x1c);
      }
      else {
        PVar5 = Symbol::EnsurePosition(sym,this);
      }
      if (local_44 == 0xffffffff) {
        local_44 = FuncInfo::AcquireTmpRegister(funcInfo);
      }
      uVar6 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar5);
      Js::ByteCodeWriter::ScopedProperty2(this_00,ScopedLdInst,local_34,uVar6,local_44);
      RVar7 = local_44;
    }
LAB_0080a07f:
    local_44 = RVar7;
    if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
             buffer == 0) {
LAB_0080a3ab:
      *pThisLocation = local_44;
      *pInstLocation = local_34;
      local_b8 = (undefined1  [8])&PTR_IsReadOnly_014dd580;
      if (recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
          _vptr_ReadOnlyList != (_func_int **)0x0) {
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                   recList.
                   super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                   _16_8_,recList.
                          super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                          ._vptr_ReadOnlyList,
                   (long)(int)recList.
                              super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                              .alloc * 0xc);
      }
      return;
    }
    if (local_34 == 0xffffffff) goto LAB_0080a092;
  }
  else {
    if (local_34 != 0xffffffff) {
      if (rec.field_2.index == 0xffffffff) {
        if (scope->innerScopeIndex == 0xffffffff) {
          if (symScope == funcInfo->paramScope) {
            if ((funcInfo->frameObjRegister == 0xffffffff) ||
               (OVar12 = LdParamObj, (funcInfo->field_0xb5 & 0x80) != 0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x1117,
                                 "(funcInfo->frameObjRegister != Js::Constants::NoRegister && !funcInfo->IsBodyAndParamScopeMerged())"
                                 ,
                                 "funcInfo->frameObjRegister != Js::Constants::NoRegister && !funcInfo->IsBodyAndParamScopeMerged()"
                                );
              OVar12 = LdParamObj;
LAB_0080a03f:
              if (bVar3 == false) goto LAB_0080a405;
              *puVar9 = 0;
            }
          }
          else {
            if (symScope != funcInfo->bodyScope) {
              Js::ByteCodeWriter::Reg2(this_00,Ld_A,local_34,rec.label);
              goto LAB_0080a05f;
            }
            OVar12 = LdLocalObj;
            if (funcInfo->frameObjRegister == 0xffffffff) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x1120,"(funcInfo->frameObjRegister != Js::Constants::NoRegister)"
                                 ,"funcInfo->frameObjRegister != Js::Constants::NoRegister");
              OVar12 = LdLocalObj;
              goto LAB_0080a03f;
            }
          }
          Js::ByteCodeWriter::Reg1(this_00,OVar12,local_34);
        }
        else {
          Js::ByteCodeWriter::Reg1Unsigned1(this_00,LdInnerScope,local_34,scope->innerScopeIndex);
        }
      }
      else {
        if ((scope->field_0x44 & 2) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x110d,"(scope->GetIsObject())","scope->GetIsObject()");
          if (!bVar3) goto LAB_0080a405;
          *puVar9 = 0;
        }
        Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,local_34,rec.field_2.index + 1);
      }
LAB_0080a05f:
      RVar7 = funcInfo->undefinedConstantRegister;
      if (local_44 != 0xffffffff) {
        Js::ByteCodeWriter::Reg2(this_00,Ld_A,local_44,RVar7);
        RVar7 = local_44;
      }
      goto LAB_0080a07f;
    }
    if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
             buffer == 0) {
      local_34 = 0xffffffff;
      goto LAB_0080a3ab;
    }
LAB_0080a092:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1130,"(instLocation != Js::Constants::NoRegister)",
                       "instLocation != Js::Constants::NoRegister");
    if (!bVar3) goto LAB_0080a405;
    *puVar9 = 0;
    local_34 = 0xffffffff;
  }
  if (local_44 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1131,"(thisLocation != Js::Constants::NoRegister)",
                       "thisLocation != Js::Constants::NoRegister");
    if (!bVar3) {
LAB_0080a405:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  labelID = Js::ByteCodeWriter::DefineLabel(this_00);
  Js::ByteCodeWriter::Br(this_00,labelID);
  pRVar1 = &funcInfo->undefinedConstantRegister;
  index = 0;
  do {
    pTVar10 = JsUtil::
              List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)local_b8,index);
    Js::ByteCodeWriter::MarkLabel(this_00,pTVar10->label);
    pTVar10 = JsUtil::
              List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)local_b8,index);
    switch(pTVar10->kind) {
    case Local:
      Js::ByteCodeWriter::Reg1(this_00,LdLocalObj_ReuseLoc,local_34);
      RVar7 = *pRVar1;
      if (local_44 != RVar7) {
        OVar12 = Ld_A_ReuseLoc;
        if (local_44 != local_34) goto LAB_0080a327;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x113f,"(thisLocation != instLocation)","thisLocation != instLocation");
LAB_0080a309:
        if (bVar3 != false) {
          *puVar9 = 0;
          OVar12 = Ld_A_ReuseLoc;
          paVar11 = (anon_union_4_2_6390a042_for_DynamicLoadRecord_2 *)pRVar1;
          goto LAB_0080a323;
        }
        goto LAB_0080a405;
      }
      break;
    case Env:
      pTVar10 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b8,index);
      Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj_ReuseLoc,local_34,(pTVar10->field_2).index);
      RVar7 = *pRVar1;
      if (local_44 != RVar7) {
        OVar12 = Ld_A_ReuseLoc;
        if (local_44 == local_34) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x1148,"(thisLocation != instLocation)","thisLocation != instLocation"
                            );
          goto LAB_0080a309;
        }
        goto LAB_0080a327;
      }
      break;
    case LocalWith:
      pTVar10 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b8,index);
      Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj_ReuseLoc,local_34,(pTVar10->field_2).instance);
      pTVar10 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b8,index);
      OVar12 = UnwrapWithObj_ReuseLoc;
      paVar11 = &pTVar10->field_2;
LAB_0080a323:
      RVar7 = paVar11->instance;
LAB_0080a327:
      Js::ByteCodeWriter::Reg2(this_00,OVar12,local_44,RVar7);
      break;
    case EnvWith:
      RVar7 = FuncInfo::AcquireTmpRegister(funcInfo);
      pTVar10 = JsUtil::
                List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                        *)local_b8,index);
      Js::ByteCodeWriter::SlotI1(this_00,LdEnvObj,RVar7,(pTVar10->field_2).index);
      Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj_ReuseLoc,local_34,RVar7);
      Js::ByteCodeWriter::Reg2(this_00,UnwrapWithObj_ReuseLoc,local_44,RVar7);
      FuncInfo::ReleaseTmpRegister(funcInfo,RVar7);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x115d,"((0))","(0)");
      if (!bVar3) goto LAB_0080a405;
      *puVar9 = 0;
    }
    if (index == (int)recList.
                      super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                      .buffer + -1) break;
    Js::ByteCodeWriter::Br(this_00,labelID);
    index = index + 1;
  } while( true );
  Js::ByteCodeWriter::MarkLabel(this_00,labelID);
  goto LAB_0080a3ab;
}

Assistant:

void ByteCodeGenerator::EmitLoadInstance(Symbol *sym, IdentPtr pid, Js::RegSlot *pThisLocation, Js::RegSlot *pInstLocation, FuncInfo *funcInfo)
{
    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::RegSlot thisLocation = *pThisLocation;
    Js::RegSlot instLocation = *pInstLocation;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    if (sym != nullptr && sym->GetIsModuleExportStorage())
    {
        *pInstLocation = Js::Constants::NoRegister;
        return;
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            break;
        }

        if (scope != symScope)
        {
            // We're not sure where the function is (eval/with/etc).
            // So we're going to need registers to hold the instance where we (dynamically) find
            // the function, and possibly to hold the "this" pointer we will pass to it.
            // Assign them here so that they can't overlap with the scopeLocation assigned below.
            // Otherwise we wind up with temp lifetime confusion in the IRBuilder. (Win8 281689)
            if (instLocation == Js::Constants::NoRegister)
            {
                instLocation = funcInfo->AcquireTmpRegister();
            }
        }

        if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        // Record dynamic scopes, in order. Define a label for each one. Remember whether we've seen a 'with'.
        // For each dynamic scope, emit BrOnHas[Env,Local]Property $Ln, where n is the scope's position in the list
        // Then emit code for default access (i.e., static binding). If no 'with', do not create a temp for 'this', just use 'undefined'.
        // End static portion with 'Br $Ldone'.
        // Then, for each item in list, emit:
        // $Ln:
        //     copy dynamic scope to 'instance' temp, using 'reuse_loc' form of the opcode
        //     do the same for 'this' temp', only if we've seen a 'with'
        //     if not the last item in the list, Br $Ldone

        DynamicLoadRecord rec;
            
        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                // The local body scope. Branch cannot bail on implicit calls.
              
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
            }
            else
            {
                // Function body scope in an enclosing function that calls eval.
                // Emit a branch opcode that does not require bail on implicit calls.

                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (thisLocation == Js::Constants::NoRegister)
            {
                thisLocation = funcInfo->AcquireTmpRegister();
            }

            if (envIndex == -1)
            {
                // With object declared in this function. HasProperty may have implicit calls.
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                // With object declared in an enclosing function. HasProperty may have implicit calls.
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    if (sym == nullptr || sym->GetIsGlobal())
    {
        if (this->flags & (fscrEval | fscrImplicitThis))
        {
            // Load of a symbol with unknown scope from within eval.
            // Get it from the closure environment.
            if (instLocation == Js::Constants::NoRegister)
            {
                instLocation = funcInfo->AcquireTmpRegister();
            }

            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            if (thisLocation == Js::Constants::NoRegister)
            {
                thisLocation = funcInfo->AcquireTmpRegister();
            }
            this->m_writer.ScopedProperty2(Js::OpCode::ScopedLdInst, instLocation,
                funcInfo->FindOrAddReferencedPropertyId(propertyId), thisLocation);
        }
        else
        {
            if (instLocation == Js::Constants::NoRegister)
            {
                instLocation = ByteCodeGenerator::RootObjectRegister;
            }
            else
            {
                this->m_writer.Reg2(Js::OpCode::Ld_A, instLocation, ByteCodeGenerator::RootObjectRegister);
            }

            if (thisLocation == Js::Constants::NoRegister)
            {
                thisLocation = funcInfo->undefinedConstantRegister;
            }
            else
            {
                this->m_writer.Reg2(Js::OpCode::Ld_A, thisLocation, funcInfo->undefinedConstantRegister);
            }
        }
    }
    else if (instLocation != Js::Constants::NoRegister)
    {
        if (envIndex != -1)
        {
            AssertOrFailFast(scope->GetIsObject());
            this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation,
                envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var));
        }
        else if (scope->HasInnerScopeIndex())
        {
            this->m_writer.Reg1Unsigned1(Js::OpCode::LdInnerScope, instLocation, scope->GetInnerScopeIndex());
        }
        else if (symScope == funcInfo->GetParamScope())
        {
            Assert(funcInfo->frameObjRegister != Js::Constants::NoRegister && !funcInfo->IsBodyAndParamScopeMerged());
            this->m_writer.Reg1(Js::OpCode::LdParamObj, instLocation);
        }
        else if (symScope != funcInfo->GetBodyScope())
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, instLocation, scopeLocation);
        }
        else
        {
            Assert(funcInfo->frameObjRegister != Js::Constants::NoRegister);
            this->m_writer.Reg1(Js::OpCode::LdLocalObj, instLocation);
        }

        if (thisLocation != Js::Constants::NoRegister)
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, thisLocation, funcInfo->undefinedConstantRegister);
        }
        else
        {
            thisLocation = funcInfo->undefinedConstantRegister;
        }
    }

    if (!recList.Empty())
    {
        Assert(instLocation != Js::Constants::NoRegister);
        Assert(thisLocation != Js::Constants::NoRegister);

        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    this->m_writer.Reg1(Js::OpCode::LdLocalObj_ReuseLoc, instLocation);
                    if (thisLocation != funcInfo->undefinedConstantRegister)
                    {
                        Assert(thisLocation != instLocation);
                        this->m_writer.Reg2(Js::OpCode::Ld_A_ReuseLoc, thisLocation, funcInfo->undefinedConstantRegister);
                    }
                    break;

                case DynamicLoadKind::Env:
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj_ReuseLoc, instLocation, recList.Item(i).index);
                    if (thisLocation != funcInfo->undefinedConstantRegister)
                    {
                        Assert(thisLocation != instLocation);
                        this->m_writer.Reg2(Js::OpCode::Ld_A_ReuseLoc, thisLocation, funcInfo->undefinedConstantRegister);
                    }
                    break;

                case DynamicLoadKind::LocalWith:
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, instLocation, recList.Item(i).instance);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, thisLocation, recList.Item(i).instance);
                    break;

                case DynamicLoadKind::EnvWith:
                {
                    Js::RegSlot tmpReg = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, tmpReg, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, instLocation, tmpReg);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, thisLocation, tmpReg);
                    funcInfo->ReleaseTmpRegister(tmpReg);
                    break;
                }

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }

    *pThisLocation = thisLocation;
    *pInstLocation = instLocation;
}